

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O3

void readPic<PicHeaderPS3>(istream *stream,PicHeader *header)

{
  pointer pPVar1;
  PicChunk *chunk;
  pointer pPVar2;
  PicChunkPS3 t_1;
  PicHeaderPS3 h;
  undefined1 local_40 [8];
  undefined1 local_38 [4];
  uint32_t local_34;
  undefined8 local_30;
  uint local_24;
  
  header->isSwitch = false;
  std::istream::read((char *)stream,(long)local_38);
  header->filesize = local_34;
  header->version = 0;
  header->ew = (undefined2)local_30;
  header->eh = local_30._2_2_;
  header->width = local_30._4_2_;
  header->height = local_30._6_2_;
  std::vector<PicChunk,_std::allocator<PicChunk>_>::resize(&header->chunks,(ulong)local_24);
  std::istream::ignore((long)stream);
  pPVar2 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    do {
      std::istream::read((char *)stream,(long)local_40);
      pPVar2->x = local_40._0_2_;
      pPVar2->y = local_40._2_2_;
      pPVar2->offset = local_40._4_4_;
      pPVar2->size = 0;
      pPVar2 = pPVar2 + 1;
    } while (pPVar2 != pPVar1);
  }
  return;
}

Assistant:

void readPic(std::istream& stream, PicHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	header.filesize = h.filesize.value();
	header.version = h.getVersion();
	header.eh = h.eh.value();
	header.ew = h.ew.value();
	header.width = h.width.value();
	header.height = h.height.value();
	header.chunks.resize(h.chunks.value());

	stream.ignore(h.bytesToSkip());

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		chunk.x = c.x.value();
		chunk.y = c.y.value();
		chunk.offset = c.offset.value();
		chunk.size = c.getSize();
	}
}